

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O3

bool __thiscall AArtiTeleport::Use(AArtiTeleport *this,bool pickup)

{
  short sVar1;
  player_t *activator;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  FPlayerStart *pFVar5;
  AActor *pAVar6;
  FSoundID local_44;
  DAngle local_40;
  DVector3 local_38;
  
  uVar2 = deathmatchstarts.Count;
  if (deathmatch.Value == 0) {
    pFVar5 = G_PickPlayerStart((int)((ulong)&((this->super_AInventory).Owner.field_0.p)->player
                                             [-0x3f3e].original_oldbuttons >> 5) * 0x3cf3cf3d,0);
  }
  else {
    uVar4 = FRandom::GenRand32(&pr_tele);
    pFVar5 = (FPlayerStart *)
             ((long)&((deathmatchstarts.Array)->pos).X + (ulong)((uVar4 & 0xff) % uVar2 << 5));
  }
  local_38.X = (pFVar5->pos).X;
  local_38.Y = (pFVar5->pos).Y;
  sVar1 = pFVar5->angle;
  pAVar6 = (this->super_AInventory).Owner.field_0.p;
  if (pAVar6 == (AActor *)0x0) {
LAB_005ed165:
    pAVar6 = (AActor *)0x0;
  }
  else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
    goto LAB_005ed165;
  }
  local_38.Z = -2147483648.0;
  local_40.Degrees = (double)(int)sVar1;
  P_Teleport(pAVar6,&local_38,&local_40,3);
  pAVar6 = (this->super_AInventory).Owner.field_0.p;
  activator = pAVar6->player;
  if ((activator->morphTics == 0) || ((activator->MorphStyle & 8) == 0)) {
LAB_005ed1e9:
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005ed1fe;
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
  }
  else {
    bVar3 = P_UndoPlayerMorph(activator,activator,8,false);
    pAVar6 = (this->super_AInventory).Owner.field_0.p;
    if (!bVar3) {
      if ((pAVar6->player->MorphStyle & 0x20) != 0) {
        return true;
      }
      goto LAB_005ed1e9;
    }
    if (pAVar6 != (AActor *)0x0) goto LAB_005ed1e9;
  }
  pAVar6 = (AActor *)0x0;
LAB_005ed1fe:
  local_44.ID = S_FindSound("*evillaugh");
  S_Sound(pAVar6,2,&local_44,1.0,0.0);
  return true;
}

Assistant:

bool AArtiTeleport::Use (bool pickup)
{
	DVector3 dest;
	int destAngle;

	if (deathmatch)
	{
		unsigned int selections = deathmatchstarts.Size ();
		unsigned int i = pr_tele() % selections;
		dest = deathmatchstarts[i].pos;
		destAngle = deathmatchstarts[i].angle;
	}
	else
	{
		FPlayerStart *start = G_PickPlayerStart(int(Owner->player - players));
		dest = start->pos;
		destAngle = start->angle;
	}
	dest.Z = ONFLOORZ;
	P_Teleport (Owner, dest, (double)destAngle, TELF_SOURCEFOG | TELF_DESTFOG);
	bool canlaugh = true;
 	if (Owner->player->morphTics && (Owner->player->MorphStyle & MORPH_UNDOBYCHAOSDEVICE))
 	{ // Teleporting away will undo any morph effects (pig)
		if (!P_UndoPlayerMorph (Owner->player, Owner->player, MORPH_UNDOBYCHAOSDEVICE)
			&& (Owner->player->MorphStyle & MORPH_FAILNOLAUGH))
		{
			canlaugh = false;
		}
 	}
	if (canlaugh)
 	{ // Full volume laugh
 		S_Sound (Owner, CHAN_VOICE, "*evillaugh", 1, ATTN_NONE);
 	}
	return true;
}